

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::impl::
     distribute_scatter<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,
               size_t total_size,comm *comm)

{
  comm *n;
  bool bVar1;
  int iVar2;
  int iVar3;
  unsigned_long uVar4;
  reference pvVar5;
  reference piVar6;
  reference out_00;
  pair<unsigned_long,_int> pVar7;
  size_t recv_size;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_sizes;
  undefined1 local_88 [8];
  block_decomposition<unsigned_long> part;
  int root;
  pair<unsigned_long,_int> max_pos;
  comm *local_38;
  size_t local_size;
  comm *comm_local;
  size_t total_size_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  local_size = (size_t)comm;
  comm_local = (comm *)total_size;
  total_size_local = (size_t)out._M_current;
  out_local = end;
  end_local = begin;
  local_38 = (comm *)std::
                     distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                               (begin,end);
  pVar7 = max_element<unsigned_long>((unsigned_long *)&local_38,(comm *)local_size);
  part.rank = pVar7.second;
  bVar1 = all_same<int>(&part.rank,(comm *)local_size);
  if (!bVar1) {
    assert_fail("mxx::all_same(root, comm)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                ,0x41,"distribute_scatter");
  }
  n = comm_local;
  iVar2 = mxx::comm::size((comm *)local_size);
  iVar3 = mxx::comm::rank((comm *)local_size);
  partition::block_decomposition<unsigned_long>::block_decomposition
            ((block_decomposition<unsigned_long> *)local_88,(unsigned_long)n,iVar2,iVar3);
  iVar2 = mxx::comm::rank((comm *)local_size);
  if (iVar2 == part.rank) {
    if (local_38 != comm_local) {
      assert_fail("local_size == total_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0x46,"distribute_scatter");
    }
    iVar2 = mxx::comm::size((comm *)local_size);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&recv_size + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,(long)iVar2,
               (allocator<unsigned_long> *)((long)&recv_size + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&recv_size + 7));
    recv_size._0_4_ = 0;
    while( true ) {
      iVar2 = (int)recv_size;
      iVar3 = mxx::comm::size((comm *)local_size);
      if (iVar3 <= iVar2) break;
      uVar4 = partition::block_decomposition<unsigned_long>::local_size
                        ((block_decomposition<unsigned_long> *)local_88,(int)recv_size);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                          (long)(int)recv_size);
      *pvVar5 = uVar4;
      recv_size._0_4_ = (int)recv_size + 1;
    }
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&end_local);
    out_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &total_size_local);
    uVar4 = partition::block_decomposition<unsigned_long>::local_size
                      ((block_decomposition<unsigned_long> *)local_88);
    scatterv<int>(piVar6,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,out_00,uVar4,
                  part.rank,(comm *)local_size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  }
  else {
    uVar4 = partition::block_decomposition<unsigned_long>::local_size
                      ((block_decomposition<unsigned_long> *)local_88);
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &total_size_local);
    scatterv_recv<int>(piVar6,uVar4,part.rank,(comm *)local_size);
  }
  partition::block_decomposition<unsigned_long>::~block_decomposition
            ((block_decomposition<unsigned_long> *)local_88);
  return;
}

Assistant:

void distribute_scatter(_InIterator begin, _InIterator end, _OutIterator out, size_t total_size, const mxx::comm& comm) {
        size_t local_size = std::distance(begin, end);
        // get root
        std::pair<size_t, int> max_pos = mxx::max_element(local_size, comm);
        int root = max_pos.second;
        MXX_ASSERT(mxx::all_same(root, comm));
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());


        if (comm.rank() == root) {
            MXX_ASSERT(local_size == total_size);
            // use scatterv to send
            std::vector<size_t> send_sizes(comm.size());
            for (int i = 0; i < comm.size(); ++i) {
                send_sizes[i] = part.local_size(i);
            }
            // TODO: scatterv with iterators rather than pointers
            mxx::scatterv(&(*begin), send_sizes, &(*out), part.local_size(), root, comm);
        } else {
            // use scatterv to receive
            size_t recv_size = part.local_size();
            mxx::scatterv_recv(&(*out), recv_size, root, comm);
        }
    }